

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,signed_char>
          (TryCast *this,string_t input,int8_t *result,bool strict)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  byte bVar11;
  TryCast *pTVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  char cVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  IntegerCastData<short> local_7e;
  undefined4 local_7c;
  IntegerDecimalCastData<signed_char> local_78;
  ulong local_58;
  int local_4c;
  byte *local_48;
  string_t input_local;
  
  local_48 = input.value._8_8_;
  uVar4 = SUB84(result,0);
  pcVar14 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar14 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = input.value._0_8_;
  uVar8 = (ulong)this & 0xffffffff;
  local_7c._0_1_ = (byte)result;
  pTVar12 = this;
  if (uVar8 != 0) {
    iVar6 = 3;
    uVar9 = 0;
    do {
      bVar1 = pcVar14[uVar9];
      pTVar12 = (TryCast *)(ulong)bVar1;
      uVar15 = (uint)bVar1;
      if ((4 < uVar15 - 9) && (uVar15 != 0x20)) {
        if (uVar15 == 0x2d) {
          uVar20 = uVar8 - uVar9;
          bVar11 = 0;
          uVar13 = 1;
          goto LAB_00ce03d2;
        }
        if (bVar1 == 0x30 && uVar8 - 1 != uVar9) {
          cVar16 = pcVar14[uVar9 + 1];
          if (cVar16 != 'B') {
            if (cVar16 != 'x') {
              if (cVar16 == 'b') goto LAB_00ce08b3;
              if (cVar16 != 'X') {
                bVar11 = 0;
                bVar21 = false;
                if (((byte)local_7c & (byte)(cVar16 - 0x30U) < 10) == 0) goto LAB_00ce09c7;
                goto LAB_00ce0475;
              }
            }
            bVar11 = 0;
            bVar1 = 0;
            uVar13 = 1;
            goto LAB_00ce0521;
          }
LAB_00ce08b3:
          uVar13 = ~uVar9 + uVar8;
          bVar21 = 1 < uVar13;
          if (!bVar21) {
            bVar11 = 0;
            goto LAB_00ce0475;
          }
          uVar20 = 1;
          bVar11 = 0;
          goto LAB_00ce08c9;
        }
LAB_00ce09c7:
        bVar11 = 0;
        bVar21 = false;
        if (((byte)local_7c & bVar1 == 0x2b) != 0) goto LAB_00ce0475;
        uVar20 = uVar8 - uVar9;
        local_58 = (ulong)(bVar1 == 0x2b);
        bVar11 = 0;
        bVar1 = 0;
        uVar13 = local_58;
        goto LAB_00ce09f9;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  bVar11 = (byte)pTVar12;
  bVar21 = false;
  goto LAB_00ce0475;
  while( true ) {
    uVar17 = uVar13 + 1;
    if ((int)(char)bVar11 < (int)(bVar1 - 0xb0) / 10) {
      bVar22 = false;
    }
    else {
      bVar11 = (bVar11 * '\n' - bVar1) + 0x30;
      bVar22 = true;
      if ((~uVar13 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar13] == '_' && (byte)local_7c == 0))
      {
        uVar17 = uVar13 + 2;
        if ((uVar8 - uVar13) - 2 == uVar9) {
          bVar22 = false;
        }
        else {
          bVar22 = (byte)(pcVar14[uVar9 + uVar17] - 0x30U) < 10;
        }
      }
    }
    bVar21 = false;
    uVar13 = uVar17;
    if (!bVar22) break;
LAB_00ce03d2:
    if (uVar20 <= uVar13) goto LAB_00ce0700;
    bVar1 = pcVar14[uVar9 + uVar13];
    if (9 < (byte)(bVar1 - 0x30)) {
      if (bVar1 == 0x2e) {
        if ((byte)local_7c != 0) goto LAB_00ce0d88;
        uVar17 = uVar13 + 1;
        if (uVar17 < uVar20) {
          iVar6 = 0;
          if (9 < (byte)(pcVar14[uVar9 + 1 + uVar13] - 0x30U)) goto LAB_00ce0d69;
          iVar7 = 1;
        }
        else {
          iVar6 = 3;
LAB_00ce0d69:
          iVar7 = 1;
          if (1 < uVar13) {
            iVar7 = iVar6;
          }
        }
        uVar13 = uVar17;
        if (iVar7 == 3) goto LAB_00ce0700;
        if (iVar7 != 0) goto LAB_00ce0d88;
      }
      bVar21 = false;
      if (((ulong)(byte)pcVar14[uVar9 + uVar13] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar13] & 0x3f) & 1) != 0)) {
        uVar17 = uVar13 + 1;
        uVar13 = uVar17;
        if (uVar20 <= uVar17) goto LAB_00ce0700;
        goto LAB_00ce0977;
      }
      break;
    }
  }
  goto LAB_00ce0475;
  while (uVar17 = uVar17 + 1, uVar13 = uVar20, uVar20 != uVar17) {
LAB_00ce0977:
    if ((0x20 < (ulong)(byte)pcVar14[uVar9 + uVar17]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar17] & 0x3f) & 1) == 0))
    goto LAB_00ce0d88;
  }
LAB_00ce0700:
  bVar21 = 1 < uVar13;
  goto LAB_00ce0475;
LAB_00ce0521:
  do {
    if (~uVar9 + uVar8 <= uVar13) goto LAB_00ce0700;
    bVar18 = pcVar14[uVar9 + 1 + uVar13];
    bVar5 = bVar18 | 0x20;
    if (0x19 < (byte)(bVar18 + 0xbf)) {
      bVar5 = bVar18;
    }
    if (9 < (byte)(bVar5 - 0x30)) {
      bVar21 = false;
      if ((0x25 < bVar5 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar16 = -0x30;
    if ('`' < (char)bVar5) {
      cVar16 = -0x57;
    }
    uVar20 = uVar13 + 1;
    if (((uVar8 - uVar13) - 2 == uVar9) || (pcVar14[uVar9 + 2 + uVar13] != '_')) {
LAB_00ce05f1:
      bVar22 = (int)(char)bVar1 <= (int)(0x7f - (uint)(byte)(cVar16 + bVar5)) / 0x10;
      if (bVar22) {
        bVar1 = cVar16 + bVar5 + bVar1 * '\x10';
        bVar11 = bVar1;
      }
    }
    else {
      uVar20 = uVar13 + 2;
      if ((uVar8 - uVar13) - 3 != uVar9) {
        if (9 < (byte)(pcVar14[uVar9 + 3 + uVar13] - 0x30U)) {
          uVar15 = (byte)pcVar14[uVar9 + 3 + uVar13] - 0x41;
          bVar22 = false;
          if ((0x25 < uVar15) ||
             (bVar22 = false, (0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0))
          goto LAB_00ce0621;
        }
        goto LAB_00ce05f1;
      }
      bVar22 = false;
    }
LAB_00ce0621:
    bVar21 = false;
    uVar13 = uVar20;
  } while (bVar22);
  goto LAB_00ce0475;
LAB_00ce08c9:
  do {
    bVar1 = 0;
    if (pcVar14[uVar9 + 1 + uVar20] != '0') {
      if (pcVar14[uVar9 + 1 + uVar20] == '1') {
        bVar1 = 1;
        goto LAB_00ce08e8;
      }
LAB_00ce0cb9:
      bVar21 = false;
      break;
    }
LAB_00ce08e8:
    uVar17 = uVar20 + 1;
    if (((uVar8 - uVar20) - 2 != uVar9) && (pcVar14[uVar9 + 2 + uVar20] == '_')) {
      if (((uVar8 - uVar20) - 3 == uVar9) || ((pcVar14[uVar9 + 3 + uVar20] & 0xfeU) != 0x30))
      goto LAB_00ce0cb9;
      uVar17 = uVar20 + 2;
    }
    uVar20 = uVar17;
    if ('?' < (char)bVar11) goto LAB_00ce0cb9;
    bVar11 = bVar1 | bVar11 * '\x02';
    bVar21 = true;
  } while (uVar20 < uVar13);
  goto LAB_00ce0475;
  while( true ) {
    uVar17 = uVar13 + 1;
    if ((char)((bVar18 ^ 0x7e) / 10) < (char)bVar1) {
      bVar22 = false;
    }
    else {
      bVar11 = bVar18 + bVar1 * '\n';
      bVar22 = true;
      bVar1 = bVar11;
      if ((~uVar13 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar13] == '_' && (byte)local_7c == 0))
      {
        uVar17 = uVar13 + 2;
        if ((uVar8 - uVar13) - 2 == uVar9) {
          bVar22 = false;
        }
        else {
          bVar22 = (byte)(pcVar14[uVar9 + uVar17] - 0x30U) < 10;
        }
      }
    }
    bVar21 = false;
    uVar13 = uVar17;
    if (!bVar22) break;
LAB_00ce09f9:
    if (uVar20 <= uVar13) goto LAB_00ce0b98;
    bVar18 = pcVar14[uVar9 + uVar13] - 0x30;
    if (9 < bVar18) {
      if (pcVar14[uVar9 + uVar13] == '.') {
        if ((byte)local_7c != 0) goto LAB_00ce0d88;
        uVar17 = uVar13 + 1;
        iVar7 = 1;
        if (((uVar20 <= uVar17) || (iVar6 = 0, 9 < (byte)(pcVar14[uVar9 + 1 + uVar13] - 0x30U))) &&
           (local_58 < uVar13)) {
          iVar7 = iVar6;
        }
        uVar13 = uVar17;
        if (iVar7 == 3) goto LAB_00ce0b98;
        if (iVar7 != 0) goto LAB_00ce0d88;
      }
      bVar21 = false;
      if (((ulong)(byte)pcVar14[uVar9 + uVar13] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar13] & 0x3f) & 1) != 0)) {
        uVar17 = uVar13 + 1;
        uVar13 = uVar17;
        if (uVar20 <= uVar17) goto LAB_00ce0b98;
        goto LAB_00ce0d42;
      }
      break;
    }
  }
  goto LAB_00ce0475;
LAB_00ce0d88:
  bVar21 = false;
  goto LAB_00ce0475;
  while( true ) {
    uVar17 = uVar20 + 1;
    if (local_78.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar21 = false;
    }
    else {
      local_78.result = local_78.result * 10 - (ulong)bVar1;
      bVar21 = true;
      if ((~uVar20 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar20] == '_' && (byte)local_7c == 0))
      {
        uVar17 = uVar20 + 2;
        if ((uVar8 - uVar20) - 2 == uVar9) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar14[uVar9 + uVar17] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar17;
    if (!bVar21) break;
LAB_00ce0664:
    if (uVar13 <= uVar20) goto LAB_00ce0aac;
    bVar1 = pcVar14[uVar9 + uVar20] - 0x30;
    if (9 < bVar1) {
      if (pcVar14[uVar9 + uVar20] != '.') goto LAB_00ce0cc6;
      if ((byte)local_7c == 0) {
        uVar17 = uVar20 + 1;
        if (uVar13 <= uVar17) {
          iVar6 = 3;
          uVar19 = uVar17;
          goto LAB_00ce1076;
        }
        local_78.decimal = 0;
        uVar3 = uVar17;
        goto LAB_00ce0b03;
      }
      break;
    }
  }
  goto LAB_00ce04af;
  while (uVar3 = uVar19, uVar19 < uVar13) {
LAB_00ce0b03:
    bVar1 = pcVar14[uVar9 + uVar3] - 0x30;
    local_58 = uVar17;
    if (9 < bVar1) {
      iVar6 = 0;
      goto LAB_00ce1066;
    }
    if (local_78.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_78.decimal_digits = local_78.decimal_digits + 1;
      local_78.decimal = local_78.decimal * 10 + (ulong)bVar1;
    }
    uVar19 = uVar3 + 1;
    if (((~uVar3 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar3] == '_')) &&
       ((uVar19 = uVar3 + 2, (uVar8 - uVar3) - 2 == uVar9 ||
        (9 < (byte)(pcVar14[uVar9 + uVar19] - 0x30U))))) {
      local_78._18_6_ = 0;
      iVar7 = 1;
      goto LAB_00ce1089;
    }
  }
  iVar6 = 3;
LAB_00ce1066:
  local_78._18_6_ = 0;
  uVar19 = uVar3;
LAB_00ce1076:
  iVar7 = 1;
  if (uVar17 < uVar19) {
    iVar7 = iVar6;
  }
  if (1 < uVar20) {
    iVar7 = iVar6;
  }
LAB_00ce1089:
  uVar20 = uVar19;
  if (iVar7 == 3) {
LAB_00ce0aac:
    bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                       (&local_78);
    if (bVar21) {
      bVar22 = 1 < uVar20;
      goto LAB_00ce04b1;
    }
  }
  else if (iVar7 == 0) {
LAB_00ce0cc6:
    bVar1 = pcVar14[uVar9 + uVar20];
    if (bVar1 - 9 < 5) {
LAB_00ce0cdc:
      uVar8 = uVar20 + 1;
      uVar20 = uVar8;
      if (uVar8 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)pcVar14[uVar9 + uVar8]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar8] & 0x3f) & 1) == 0))
          goto LAB_00ce04af;
          uVar8 = uVar8 + 1;
          uVar20 = uVar13;
        } while (uVar13 != uVar8);
      }
      goto LAB_00ce0aac;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar20 != 1 && (byte)local_7c == 0) && (uVar20 + 1 < uVar13)) {
        local_7e.result = 0;
        pcVar14 = pcVar14 + uVar9 + uVar20 + 1;
        iVar10 = ~uVar9 + (uVar8 - uVar20);
        if (*pcVar14 == '-') {
          bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar10,&local_7e,false);
        }
        else {
          bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar10,&local_7e,false);
        }
        bVar22 = false;
        if (bVar21 != false) {
          bVar22 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                             (&local_78,local_7e.result);
        }
        goto LAB_00ce04b1;
      }
    }
    else if (bVar1 == 0x20) goto LAB_00ce0cdc;
  }
  goto LAB_00ce04af;
  while( true ) {
    uVar20 = uVar3;
    if (0x3fffffffffffffff < local_78.result) goto LAB_00ce04af;
    local_78.result = uVar17 + local_78.result * 2;
    if (uVar13 <= uVar20) break;
LAB_00ce0c21:
    if (pcVar14[uVar9 + 1 + uVar20] == '0') {
      uVar17 = 0;
    }
    else {
      uVar17 = 1;
      if (pcVar14[uVar9 + 1 + uVar20] != '1') goto LAB_00ce04af;
    }
    uVar3 = uVar20 + 1;
    if (((uVar8 - uVar20) - 2 != uVar9) && (pcVar14[uVar9 + 2 + uVar20] == '_')) {
      if (((uVar8 - uVar20) - 3 == uVar9) || ((pcVar14[uVar9 + 3 + uVar20] & 0xfeU) != 0x30))
      goto LAB_00ce04af;
      uVar3 = uVar20 + 2;
    }
  }
LAB_00ce0c9e:
  bVar22 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     (&local_78);
  bVar22 = bVar22 && 1 < uVar13;
  goto LAB_00ce04b1;
LAB_00ce07a8:
  do {
    if (~uVar9 + uVar8 <= uVar13) {
      bVar22 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_78);
      bVar22 = 1 < uVar13 && bVar22;
      goto LAB_00ce04b1;
    }
    bVar1 = pcVar14[uVar9 + 1 + uVar13];
    bVar11 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar11 = bVar1;
    }
    if ((9 < (byte)(bVar11 - 0x30)) &&
       ((0x25 < bVar11 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar11 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar16 = -0x57;
    if ((char)bVar11 < 'a') {
      cVar16 = -0x30;
    }
    uVar20 = uVar13 + 1;
    if (((uVar8 - uVar13) - 2 == uVar9) || (pcVar14[uVar9 + 2 + uVar13] != '_')) {
LAB_00ce0879:
      uVar13 = (ulong)((byte)(cVar16 + bVar11) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_78.result;
      if (local_78.result <= (long)uVar13) {
        lVar2 = local_78.result * 0x10 + (ulong)(byte)(cVar16 + bVar11);
      }
      bVar21 = local_78.result <= (long)uVar13;
      local_78.result = lVar2;
    }
    else {
      uVar20 = uVar13 + 2;
      if ((uVar8 - uVar13) - 3 != uVar9) {
        if (9 < (byte)(pcVar14[uVar9 + 3 + uVar13] - 0x30U)) {
          uVar15 = (byte)pcVar14[uVar9 + 3 + uVar13] - 0x41;
          bVar21 = false;
          if ((0x25 < uVar15) ||
             (bVar21 = false, (0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0))
          goto LAB_00ce08a0;
        }
        goto LAB_00ce0879;
      }
      bVar21 = false;
    }
LAB_00ce08a0:
    uVar13 = uVar20;
  } while (bVar21);
  goto LAB_00ce04af;
  while( true ) {
    uVar17 = uVar20 + 1;
    bVar21 = false;
    if (local_78.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_78.result = local_78.result * 10 + (ulong)bVar1;
      bVar21 = true;
      if ((~uVar20 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar20] == '_' && (byte)local_7c == 0))
      {
        uVar17 = uVar20 + 2;
        if ((uVar8 - uVar20) - 2 == uVar9) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar14[uVar9 + uVar17] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar17;
    if (!bVar21) break;
LAB_00ce0dc2:
    if (uVar13 <= uVar20) goto LAB_00ce0e90;
    bVar1 = pcVar14[uVar9 + uVar20] - 0x30;
    if (9 < bVar1) {
      if (pcVar14[uVar9 + uVar20] != '.') goto LAB_00ce0fa2;
      if ((byte)local_7c == 0) {
        uVar17 = uVar20 + 1;
        if (uVar13 <= uVar17) {
          iVar6 = 3;
          uVar19 = uVar17;
          goto LAB_00ce1143;
        }
        local_78.decimal = 0;
        local_4c = 0;
        uVar3 = uVar17;
        goto LAB_00ce0ee6;
      }
      break;
    }
  }
  goto LAB_00ce04af;
  while (uVar3 = uVar19, uVar19 < uVar13) {
LAB_00ce0ee6:
    bVar1 = pcVar14[uVar9 + uVar3] - 0x30;
    if (9 < bVar1) {
      iVar6 = 0;
      goto LAB_00ce1135;
    }
    if (local_78.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_4c = local_4c + 1;
      local_78.decimal = local_78.decimal * 10 + (ulong)bVar1;
    }
    uVar19 = uVar3 + 1;
    if (((~uVar3 + uVar8 != uVar9) && (pcVar14[uVar9 + 1 + uVar3] == '_')) &&
       ((uVar19 = uVar3 + 2, (uVar8 - uVar3) - 2 == uVar9 ||
        (9 < (byte)(pcVar14[uVar9 + uVar19] - 0x30U))))) {
      local_78._18_6_ = 0;
      local_78.decimal_digits = (ushort)local_4c;
      iVar7 = 1;
      goto LAB_00ce115d;
    }
  }
  iVar6 = 3;
LAB_00ce1135:
  local_78._18_6_ = 0;
  local_78.decimal_digits = (ushort)local_4c;
  uVar19 = uVar3;
LAB_00ce1143:
  iVar7 = 1;
  if (uVar17 < uVar19) {
    iVar7 = iVar6;
  }
  if (local_58 < uVar20) {
    iVar7 = iVar6;
  }
LAB_00ce115d:
  uVar20 = uVar19;
  if (iVar7 == 3) {
LAB_00ce0e90:
    bVar21 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_78);
    if (bVar21) {
      bVar22 = local_58 < uVar20;
      goto LAB_00ce04b1;
    }
  }
  else if (iVar7 == 0) {
LAB_00ce0fa2:
    bVar1 = pcVar14[uVar9 + uVar20];
    if (bVar1 - 9 < 5) {
LAB_00ce0fb8:
      uVar8 = uVar20 + 1;
      uVar20 = uVar8;
      if (uVar8 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)pcVar14[uVar9 + uVar8]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar8] & 0x3f) & 1) == 0))
          goto LAB_00ce04af;
          uVar8 = uVar8 + 1;
          uVar20 = uVar13;
        } while (uVar13 != uVar8);
      }
      goto LAB_00ce0e90;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar20 != local_58 && (byte)local_7c == 0) && (uVar20 + 1 < uVar13)) {
        local_7e.result = 0;
        pcVar14 = pcVar14 + uVar9 + uVar20 + 1;
        iVar10 = ~uVar9 + (uVar8 - uVar20);
        if (*pcVar14 == '-') {
          bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar10,&local_7e,false);
        }
        else {
          bVar21 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar14,iVar10,&local_7e,false);
        }
        bVar22 = false;
        if (bVar21 != false) {
          bVar22 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                             (&local_78,local_7e.result);
        }
        goto LAB_00ce04b1;
      }
    }
    else if (bVar1 == 0x20) goto LAB_00ce0fb8;
  }
  goto LAB_00ce04af;
  while (uVar17 = uVar17 + 1, uVar13 = uVar20, uVar20 != uVar17) {
LAB_00ce0d42:
    if ((0x20 < (ulong)(byte)pcVar14[uVar9 + uVar17]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar14[uVar9 + uVar17] & 0x3f) & 1) == 0))
    goto LAB_00ce0d88;
  }
LAB_00ce0b98:
  bVar21 = local_58 < uVar13;
LAB_00ce0475:
  if (bVar21) {
    *local_48 = bVar11;
    bVar22 = true;
  }
  else {
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        bVar1 = pcVar14[uVar9];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_78.result = 0;
          local_78.decimal = 0;
          local_78._16_8_ = 0;
          uVar13 = uVar8 - uVar9;
          local_78.decimal_digits = 0;
          local_7c = uVar4;
          input_local.value._0_8_ = this;
          if (bVar1 == 0x2d) {
            local_78.result = 0;
            uVar20 = 1;
            goto LAB_00ce0664;
          }
          if (bVar1 == 0x30 && uVar8 - 1 != uVar9) {
            cVar16 = pcVar14[uVar9 + 1];
            if (cVar16 == 'B') {
LAB_00ce0bf9:
              uVar13 = ~uVar9 + uVar8;
              if (uVar13 < 2) goto LAB_00ce0c9e;
              local_78.result = 0;
              uVar20 = 1;
              goto LAB_00ce0c21;
            }
            if (cVar16 != 'x') {
              if (cVar16 == 'b') goto LAB_00ce0bf9;
              if (cVar16 != 'X') {
                if (((byte)local_7c & (byte)(cVar16 - 0x30U) < 10) == 0) goto LAB_00ce0da3;
                break;
              }
            }
            local_78.result = 0;
            uVar13 = 1;
            goto LAB_00ce07a8;
          }
LAB_00ce0da3:
          if (((byte)local_7c & bVar1 == 0x2b) == 0) {
            local_58 = (ulong)(bVar1 == 0x2b);
            local_78.result = 0;
            uVar20 = local_58;
            goto LAB_00ce0dc2;
          }
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
LAB_00ce04af:
    bVar22 = false;
LAB_00ce04b1:
    if (bVar22 != false) {
      *local_48 = (byte)local_78.result;
    }
  }
  return bVar22;
}

Assistant:

bool TryCast::Operation(string_t input, int8_t &result, bool strict) {
	return TrySimpleIntegerCast<int8_t>(input.GetData(), input.GetSize(), result, strict);
}